

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
          (String *__return_storage_ptr__,kj *this,char (*params) [3],ArrayPtr<const_char> *params_1
          ,char (*params_2) [19])

{
  char (*value) [3];
  ArrayPtr<const_char> *value_00;
  char (*value_01) [19];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> *local_28;
  char (*params_local_2) [19];
  ArrayPtr<const_char> *params_local_1;
  char (*params_local) [3];
  
  local_28 = params_1;
  params_local_2 = (char (*) [19])params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (char (*) [3])__return_storage_ptr__;
  value = ::const((char (*) [3])this);
  local_38 = toCharSequence<char_const(&)[3]>(value);
  value_00 = fwd<kj::ArrayPtr<char_const>&>((ArrayPtr<const_char> *)params_local_2);
  local_48 = toCharSequence<kj::ArrayPtr<char_const>&>(value_00);
  value_01 = ::const((char (*) [19])local_28);
  local_58 = toCharSequence<char_const(&)[19]>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}